

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O0

void __thiscall wasm::SExpressionWasmBuilder::parseExport(SExpressionWasmBuilder *this,Element *s)

{
  Module *pMVar1;
  bool bVar2;
  Element *pEVar3;
  char *pcVar4;
  pointer pEVar5;
  Export *pEVar6;
  ParseException *pPVar7;
  IString IVar8;
  IString str;
  IString str_00;
  IString str_01;
  allocator<char> local_189;
  string local_188;
  size_t local_168;
  char *pcStack_160;
  string_view local_150;
  Name local_140;
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128;
  string_view local_108;
  string_view local_f8;
  string_view local_e8;
  Element *local_d8;
  size_t sStack_d0;
  string_view local_c8;
  Element *local_b8;
  size_t sStack_b0;
  string_view local_a8;
  Name local_98;
  Element *local_88;
  size_t sStack_80;
  string_view local_78;
  Element *local_68;
  size_t sStack_60;
  Element *local_58;
  Element *inner;
  char *local_40;
  char *local_38;
  Name local_30;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_20;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> ex;
  Element *s_local;
  SExpressionWasmBuilder *this_local;
  
  ex._M_t.super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
  super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)
       (__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>)s;
  std::make_unique<wasm::Export>();
  pEVar3 = Element::operator[]((Element *)
                               ex._M_t.
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,1);
  IVar8 = Element::str(pEVar3);
  local_38 = IVar8.str._M_str;
  pcVar4 = (char *)IVar8.str._M_len;
  local_40 = pcVar4;
  wasm::Name::Name(&local_30,IVar8);
  pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(&local_20);
  wasm::Name::operator=(&pEVar5->name,&local_30);
  pEVar3 = Element::operator[]((Element *)
                               ex._M_t.
                               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                               .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,2);
  bVar2 = Element::isList(pEVar3);
  if (bVar2) {
    local_58 = Element::operator[]((Element *)
                                   ex._M_t.
                                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                   .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,2);
    local_68 = FUNC;
    sStack_60 = DAT_027e5760;
    IVar8.str._M_str = pcVar4;
    IVar8.str._M_len = DAT_027e5760;
    bVar2 = elementStartsWith((wasm *)local_58,FUNC,IVar8);
    if (bVar2) {
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (&local_20);
      pEVar5->kind = Function;
      pEVar3 = Element::operator[](local_58,1);
      local_78 = (string_view)getFunctionName(this,pEVar3);
      pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (&local_20);
      wasm::Name::operator=(&pEVar5->value,(Name *)&local_78);
    }
    else {
      local_88 = MEMORY;
      sStack_80 = DAT_027e5790;
      str.str._M_str = pcVar4;
      str.str._M_len = DAT_027e5790;
      bVar2 = elementStartsWith((wasm *)local_58,MEMORY,str);
      if (bVar2) {
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (&local_20);
        pEVar5->kind = Memory;
        pEVar3 = Element::operator[](local_58,1);
        local_a8 = (string_view)Element::str(pEVar3);
        wasm::Name::Name(&local_98,(IString)local_a8);
        pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (&local_20);
        wasm::Name::operator=(&pEVar5->value,&local_98);
      }
      else {
        local_b8 = TABLE;
        sStack_b0 = DAT_027e57e0;
        str_00.str._M_str = pcVar4;
        str_00.str._M_len = DAT_027e57e0;
        bVar2 = elementStartsWith((wasm *)local_58,TABLE,str_00);
        if (bVar2) {
          pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_20);
          pEVar5->kind = Table;
          pEVar3 = Element::operator[](local_58,1);
          local_c8 = (string_view)getTableName(this,pEVar3);
          pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (&local_20);
          wasm::Name::operator=(&pEVar5->value,(Name *)&local_c8);
        }
        else {
          local_d8 = GLOBAL;
          sStack_d0 = DAT_027e5750;
          str_01.str._M_str = pcVar4;
          str_01.str._M_len = DAT_027e5750;
          bVar2 = elementStartsWith((wasm *)local_58,GLOBAL,str_01);
          if (bVar2) {
            pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                               (&local_20);
            pEVar5->kind = Global;
            pEVar3 = Element::operator[](local_58,1);
            local_e8 = (string_view)getGlobalName(this,pEVar3);
            pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                               (&local_20);
            wasm::Name::operator=(&pEVar5->value,(Name *)&local_e8);
          }
          else {
            pEVar3 = Element::operator[](local_58,0);
            local_f8 = (string_view)Element::str(pEVar3);
            bVar2 = IString::operator==((IString *)&local_f8,(IString *)TAG);
            if (!bVar2) {
              local_12a = 1;
              pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_128,"invalid export",&local_129);
              ParseException::ParseException(pPVar7,&local_128,local_58->line,local_58->col);
              local_12a = 0;
              __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
            }
            pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                               (&local_20);
            pEVar5->kind = Tag;
            pEVar3 = Element::operator[](local_58,1);
            local_108 = (string_view)getTagName(this,pEVar3);
            pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                               (&local_20);
            wasm::Name::operator=(&pEVar5->value,(Name *)&local_108);
          }
        }
      }
    }
  }
  else {
    pEVar3 = Element::operator[]((Element *)
                                 ex._M_t.
                                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                 .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl,2);
    local_150 = (string_view)Element::str(pEVar3);
    wasm::Name::Name(&local_140,(IString)local_150);
    pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       (&local_20);
    wasm::Name::operator=(&pEVar5->value,&local_140);
    pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                       (&local_20);
    pEVar5->kind = Function;
  }
  pMVar1 = this->wasm;
  pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(&local_20);
  local_168 = (pEVar5->name).super_IString.str._M_len;
  pcStack_160 = (pEVar5->name).super_IString.str._M_str;
  pEVar6 = Module::getExportOrNull(pMVar1,(Name)(pEVar5->name).super_IString.str);
  if (pEVar6 != (Export *)0x0) {
    pPVar7 = (ParseException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"duplicate export",&local_189);
    ParseException::ParseException
              (pPVar7,&local_188,
               *(size_t *)
                ((long)ex._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x40),
               *(size_t *)
                ((long)ex._M_t.
                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                       super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl + 0x48));
    __cxa_throw(pPVar7,&ParseException::typeinfo,ParseException::~ParseException);
  }
  pMVar1 = this->wasm;
  pEVar5 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::release(&local_20);
  Module::addExport(pMVar1,pEVar5);
  std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseExport(Element& s) {
  std::unique_ptr<Export> ex = std::make_unique<Export>();
  ex->name = s[1]->str();
  if (s[2]->isList()) {
    auto& inner = *s[2];
    if (elementStartsWith(inner, FUNC)) {
      ex->kind = ExternalKind::Function;
      ex->value = getFunctionName(*inner[1]);
    } else if (elementStartsWith(inner, MEMORY)) {
      ex->kind = ExternalKind::Memory;
      ex->value = inner[1]->str();
    } else if (elementStartsWith(inner, TABLE)) {
      ex->kind = ExternalKind::Table;
      ex->value = getTableName(*inner[1]);
    } else if (elementStartsWith(inner, GLOBAL)) {
      ex->kind = ExternalKind::Global;
      ex->value = getGlobalName(*inner[1]);
    } else if (inner[0]->str() == TAG) {
      ex->kind = ExternalKind::Tag;
      ex->value = getTagName(*inner[1]);
    } else {
      throw ParseException("invalid export", inner.line, inner.col);
    }
  } else {
    // function
    ex->value = s[2]->str();
    ex->kind = ExternalKind::Function;
  }
  if (wasm.getExportOrNull(ex->name)) {
    throw ParseException("duplicate export", s.line, s.col);
  }
  wasm.addExport(ex.release());
}